

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O0

vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> * __thiscall
dg::pta::PointerGraph::getNodes<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>>
          (PointerGraph *this,vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *start,
          bool interprocedural,uint expected_num)

{
  byte in_CL;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *in_RSI;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *in_RDI;
  int in_R8D;
  BFS<dg::pta::PSNode,_DfsIdTracker,_EdgeChooser> bfs;
  EdgeChooser chooser;
  DfsIdTracker visitTracker;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *cont;
  BFS<dg::pta::PSNode,_DfsIdTracker,_EdgeChooser> *in_stack_ffffffffffffff48;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *pvVar1;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 uVar2;
  NodesWalk<dg::pta::PSNode,_dg::ADT::QueueFIFO<dg::pta::PSNode_*>,_DfsIdTracker,_EdgeChooser>
  *in_stack_ffffffffffffff78;
  anon_class_8_1_898a5c30 in_stack_ffffffffffffff80;
  EdgeChooser local_29;
  undefined4 local_28;
  byte local_21;
  int local_20;
  byte local_19;
  
  local_19 = in_CL & 1;
  *(int *)&(in_RSI->super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>).
           _M_impl.super__Vector_impl_data._M_start =
       *(int *)&(in_RSI->super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>).
                _M_impl.super__Vector_impl_data._M_start + 1;
  local_21 = 0;
  pvVar1 = in_RDI;
  local_20 = in_R8D;
  std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::vector
            ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)0x1571a0);
  if (local_20 != 0) {
    std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::reserve
              (in_stack_ffffffffffffff80.cont,(size_type)in_stack_ffffffffffffff78);
  }
  getNodes<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>::DfsIdTracker::
  DfsIdTracker((DfsIdTracker *)&local_28,
               *(uint *)&(in_RSI->
                         super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>).
                         _M_impl.super__Vector_impl_data._M_start);
  getNodes<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>::EdgeChooser::
  EdgeChooser(&local_29,(bool)(local_19 & 1));
  uVar2 = CONCAT13(local_29,(int3)in_stack_ffffffffffffff70);
  BFS<dg::pta::PSNode,_DfsIdTracker,_EdgeChooser>::BFS
            (in_stack_ffffffffffffff48,(DfsIdTracker)(uint)((ulong)pvVar1 >> 0x20),
             (EdgeChooser)SUB81((ulong)pvVar1 >> 0x18,0));
  NodesWalk<dg::pta::PSNode,dg::ADT::QueueFIFO<dg::pta::PSNode*>,dg::pta::PointerGraph::getNodes<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>>(std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>const&,bool,unsigned_int)::DfsIdTracker,dg::pta::PointerGraph::getNodes<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>>(std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>const&,bool,unsigned_int)::EdgeChooser>
  ::
  run<dg::pta::PointerGraph::getNodes<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>>(std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>const&,bool,unsigned_int)::_lambda(dg::pta::PSNode*)_1_,std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>>
            (in_stack_ffffffffffffff78,
             (vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
             CONCAT44(local_28,uVar2),in_stack_ffffffffffffff80);
  local_21 = 1;
  BFS<dg::pta::PSNode,_DfsIdTracker,_EdgeChooser>::~BFS
            ((BFS<dg::pta::PSNode,_DfsIdTracker,_EdgeChooser> *)0x157246);
  if ((local_21 & 1) == 0) {
    std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::~vector(in_RSI);
  }
  return in_RDI;
}

Assistant:

std::vector<PSNode *> getNodes(const ContainerOrNode &start,
                                   bool interprocedural = true,
                                   unsigned expected_num = 0) {
        ++dfsnum;

        std::vector<PSNode *> cont;
        if (expected_num != 0)
            cont.reserve(expected_num);

        struct DfsIdTracker {
            const unsigned dfsnum;
            DfsIdTracker(unsigned dnum) : dfsnum(dnum) {}

            void visit(PSNode *n) { n->dfsid = dfsnum; }
            bool visited(PSNode *n) const { return n->dfsid == dfsnum; }
        };

        // iterate over successors and call (return) edges
        struct EdgeChooser {
            const bool interproc;
            EdgeChooser(bool inter = true) : interproc(inter) {}

            void foreach (PSNode *cur, std::function<void(PSNode *)> Dispatch) {
                if (interproc) {
                    if (PSNodeCall *C = PSNodeCall::get(cur)) {
                        for (auto *subg : C->getCallees()) {
                            Dispatch(subg->root);
                        }
                        // we do not need to iterate over succesors
                        // if we dive into the procedure (as we will
                        // return via call return)
                        // NOTE: we must iterate over successors if the
                        // function is undefined
                        if (!C->getCallees().empty())
                            return;
                    } else if (PSNodeRet *R = PSNodeRet::get(cur)) {
                        for (auto *ret : R->getReturnSites()) {
                            Dispatch(ret);
                        }
                        if (!R->getReturnSites().empty())
                            return;
                    }
                }

                for (auto *s : cur->successors())
                    Dispatch(s);
            }
        };

        DfsIdTracker visitTracker(dfsnum);
        EdgeChooser chooser(interprocedural);
        BFS<PSNode, DfsIdTracker, EdgeChooser> bfs(visitTracker, chooser);

        bfs.run(start, [&cont](PSNode *n) { cont.push_back(n); });

        return cont;
    }